

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::FlushExprTreeVector
          (WatWriter *this,
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          *expr_trees)

{
  ExprType EVar1;
  pointer pEVar2;
  IfExceptExpr *expr;
  char *__function;
  long lVar3;
  pointer pEVar4;
  TryExpr *try_expr;
  ExprVisitor local_c8;
  Delegate local_78;
  ExprVisitorDelegate delegate;
  ExprTree expr_tree;
  
  pEVar4 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar4 != pEVar2) {
    do {
      expr = (IfExceptExpr *)pEVar4->expr;
      lVar3 = (long)(pEVar4->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar4->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      expr_tree.expr = (Expr *)0x0;
      expr_tree.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr_tree.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      delegate.writer_ = (WatWriter *)expr;
      expr_tree.expr =
           (Expr *)std::
                   _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                  *)(lVar3 >> 5),(size_t)expr_trees);
      expr_tree.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar3 + (long)expr_tree.expr);
      expr_tree.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)expr_tree.expr;
      expr_tree.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar4;
      expr_tree.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start =
           std::__uninitialized_copy<false>::
           __uninit_copy<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>,wabt::(anonymous_namespace)::ExprTree*>
                     ((pEVar4->children).
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pEVar4->children).
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(ExprTree *)expr_tree.expr);
      EVar1 = (expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_;
      if ((int)EVar1 < 0x14) {
        if (EVar1 == Block) {
          WritePuts(this,"(",None);
          if ((expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_ == Block) {
            Opcode::GetInfo((Info *)&local_c8,(Opcode *)&Opcode::Block_Opcode);
            WriteBeginBlock(this,Block,&expr->true_,(char *)local_c8.delegate_);
            if ((expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_ == Block) {
LAB_00f7e115:
              WriteFoldedExprList(this,&(expr->true_).exprs);
              FlushExprTreeStack(this);
              goto LAB_00f7e1b5;
            }
          }
          __function = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
          ;
LAB_00f7e21a:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                        ,0x48,__function);
        }
        if (EVar1 == If) {
          WritePuts(this,"(",None);
          Opcode::GetInfo((Info *)&local_c8,(Opcode *)&Opcode::If_Opcode);
          WriteBeginBlock(this,If,&expr->true_,(char *)local_c8.delegate_);
          FlushExprTreeVector(this,(vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                    *)&expr_tree);
          WritePuts(this,"(",None);
          WritePuts(this,"then",Newline);
          this->indent_ = this->indent_ + 2;
          WriteFoldedExprList(this,&(expr->true_).exprs);
          FlushExprTreeStack(this);
          WriteClose(this,Newline);
          if ((expr->false_).size_ != 0) {
            WritePuts(this,"(",None);
            WritePuts(this,"else",Newline);
            goto LAB_00f7e03c;
          }
        }
        else {
LAB_00f7e134:
          WritePuts(this,"(",None);
          local_78._vptr_Delegate = (_func_int **)&PTR__Delegate_0155e1a8;
          delegate.super_Delegate._vptr_Delegate = (_func_int **)this;
          ExprVisitor::ExprVisitor(&local_c8,&local_78);
          ExprVisitor::VisitExpr(&local_c8,(Expr *)expr);
          if (local_c8.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_c8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.expr_stack_.
                            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_c8.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          this->indent_ = this->indent_ + 2;
          FlushExprTreeVector(this,(vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                    *)&expr_tree);
        }
      }
      else {
        if (EVar1 == IfExcept) {
          WritePuts(this,"(",None);
          WriteBeginIfExceptBlock(this,expr);
          FlushExprTreeVector(this,(vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                    *)&expr_tree);
          WritePuts(this,"(",None);
          WritePuts(this,"then",Newline);
          this->indent_ = this->indent_ + 2;
          WriteFoldedExprList(this,&(expr->true_).exprs);
          FlushExprTreeStack(this);
          WriteClose(this,Newline);
          if ((expr->false_).size_ == 0) goto LAB_00f7e1b5;
          WritePuts(this,"(",None);
          WritePuts(this,"else",Newline);
        }
        else {
          if (EVar1 == Loop) {
            WritePuts(this,"(",None);
            if ((expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_ == Loop) {
              Opcode::GetInfo((Info *)&local_c8,(Opcode *)&Opcode::Loop_Opcode);
              WriteBeginBlock(this,Loop,&expr->true_,(char *)local_c8.delegate_);
              if ((expr->super_ExprMixin<(wabt::ExprType)20>).super_Expr.type_ == Loop)
              goto LAB_00f7e115;
            }
            __function = 
            "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
            ;
            goto LAB_00f7e21a;
          }
          if (EVar1 != Try) goto LAB_00f7e134;
          WritePuts(this,"(",None);
          Opcode::GetInfo((Info *)&local_c8,(Opcode *)&Opcode::Try_Opcode);
          WriteBeginBlock(this,Try,&expr->true_,(char *)local_c8.delegate_);
          FlushExprTreeVector(this,(vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                    *)&expr_tree);
          WriteFoldedExprList(this,&(expr->true_).exprs);
          FlushExprTreeStack(this);
          WritePuts(this,"(",None);
          WritePuts(this,"catch",Newline);
        }
LAB_00f7e03c:
        this->indent_ = this->indent_ + 2;
        WriteFoldedExprList(this,&expr->false_);
        FlushExprTreeStack(this);
        WriteClose(this,Newline);
      }
LAB_00f7e1b5:
      expr_trees = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    *)0x2;
      WriteClose(this,Newline);
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::~vector((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 *)&expr_tree);
      pEVar4 = expr_tree.children.
               super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
    } while (pEVar4 != pEVar2);
  }
  return;
}

Assistant:

void WatWriter::FlushExprTreeVector(const std::vector<ExprTree>& expr_trees) {
  WABT_TRACE_ARGS(FlushExprTreeVector, "%zu", expr_trees.size());
  for (auto expr_tree : expr_trees) {
    FlushExprTree(expr_tree);
  }
}